

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::ComputeFlowTest_CheckOutput_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ComputeFlowTest_CheckOutput_Test> *this
            )

{
  ComputeFlowTest *this_00;
  
  WithParamInterface<void(*)(unsigned_char_const*,unsigned_char_const*,int,int,int,int,int,double*,double*)>
  ::parameter_ = &this->parameter_;
  this_00 = (ComputeFlowTest *)operator_new(0x28);
  anon_unknown.dwarf_20b6e07::ComputeFlowTest::ComputeFlowTest(this_00);
  (this_00->
  super_TestWithParam<void_(*)(const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int,_double_*,_double_*)>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_0105a260;
  (this_00->
  super_TestWithParam<void_(*)(const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int,_double_*,_double_*)>
  ).
  super_WithParamInterface<void_(*)(const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int,_double_*,_double_*)>
  ._vptr_WithParamInterface = (_func_int **)&PTR__ComputeFlowTest_CheckOutput_Test_0105a2a0;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }